

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upnpapi.c
# Opt level: O3

int UpnpSendActionEx(UpnpClient_Handle Hnd,char *ActionURL_const,char *ServiceType_const,
                    char *DevUDN_const,IXML_Document *Header,IXML_Document *Action,
                    IXML_Document **RespNodePtr)

{
  Upnp_Handle_Type UVar1;
  int iVar2;
  Handle_Info **HndInfo;
  Handle_Info *local_38;
  
  iVar2 = -0x74;
  if (UpnpSdkInit == 1) {
    iVar2 = 6;
    UpnpPrintf(UPNP_ALL,API,".upnp/src/api/upnpapi.c",0xb84,"Inside UpnpSendActionEx\n");
    if (Header == (IXML_Document *)0x0) {
      iVar2 = UpnpSendAction(Hnd,ActionURL_const,ServiceType_const,DevUDN_const,Action,RespNodePtr);
      return iVar2;
    }
    HandleReadLock((char *)0xb90,iVar2);
    HndInfo = &local_38;
    UVar1 = GetHandleInfo(Hnd,HndInfo);
    if (UVar1 == HND_CLIENT) {
      HandleUnlock((char *)0xb98,(int)HndInfo);
      iVar2 = -0x65;
      if ((ActionURL_const != (char *)0x0) &&
         (RespNodePtr != (IXML_Document **)0x0 &&
          (Action != (IXML_Document *)0x0 && ServiceType_const != (char *)0x0))) {
        iVar2 = SoapSendActionEx(ActionURL_const,ServiceType_const,Header,Action,RespNodePtr);
        UpnpPrintf(UPNP_ALL,API,".upnp/src/api/upnpapi.c",0xba5,"Exiting UpnpSendAction \n");
      }
    }
    else {
      HandleUnlock((char *)0xb95,(int)HndInfo);
      iVar2 = -100;
    }
  }
  return iVar2;
}

Assistant:

int UpnpSendActionEx(UpnpClient_Handle Hnd,
	const char *ActionURL_const,
	const char *ServiceType_const,
	const char *DevUDN_const,
	IXML_Document *Header,
	IXML_Document *Action,
	IXML_Document **RespNodePtr)
{
	struct Handle_Info *SInfo = NULL;
	int retVal = 0;
	char *ActionURL = (char *)ActionURL_const;
	char *ServiceType = (char *)ServiceType_const;
	/* udn not used? */
	/*char *DevUDN = (char *)DevUDN_const;*/

	if (UpnpSdkInit != 1) {
		return UPNP_E_FINISH;
	}

	UpnpPrintf(
		UPNP_ALL, API, __FILE__, __LINE__, "Inside UpnpSendActionEx\n");

	if (Header == NULL) {
		retVal = UpnpSendAction(Hnd,
			ActionURL_const,
			ServiceType_const,
			DevUDN_const,
			Action,
			RespNodePtr);
		return retVal;
	}

	HandleReadLock(__FILE__, __LINE__);
	switch (GetHandleInfo(Hnd, &SInfo)) {
	case HND_CLIENT:
		break;
	default:
		HandleUnlock(__FILE__, __LINE__);
		return UPNP_E_INVALID_HANDLE;
	}
	HandleUnlock(__FILE__, __LINE__);

	if (ActionURL == NULL) {
		return UPNP_E_INVALID_PARAM;
	}
	if (ServiceType == NULL || Action == NULL || RespNodePtr == NULL) {
		return UPNP_E_INVALID_PARAM;
	}

	retVal = SoapSendActionEx(
		ActionURL, ServiceType, Header, Action, RespNodePtr);

	UpnpPrintf(
		UPNP_ALL, API, __FILE__, __LINE__, "Exiting UpnpSendAction \n");

	return retVal;
}